

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_encodeSequences
                 (void *dst,size_t dstCapacity,FSE_CTable *CTable_MatchLength,BYTE *mlCodeTable,
                 FSE_CTable *CTable_OffsetBits,BYTE *ofCodeTable,FSE_CTable *CTable_LitLength,
                 BYTE *llCodeTable,seqDef *sequences,size_t nbSeq,int longOffsets,int bmi2)

{
  ulong *puVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  int iVar7;
  size_t sVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong *puVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong *puVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  ulong *puVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  ulong local_b8;
  ulong local_b0;
  
  if (bmi2 != 0) {
    sVar8 = ZSTD_encodeSequences_bmi2
                      (dst,dstCapacity,CTable_MatchLength,mlCodeTable,CTable_OffsetBits,ofCodeTable,
                       CTable_LitLength,llCodeTable,sequences,nbSeq,longOffsets);
    return sVar8;
  }
  if (dstCapacity < 9) {
    return 0xffffffffffffffba;
  }
  uVar3 = (ushort)*CTable_MatchLength;
  uVar18 = (ulong)mlCodeTable[nbSeq - 1];
  lVar9 = (long)(1 << ((char)uVar3 - 1U & 0x1f));
  if (uVar3 == 0) {
    lVar9 = 1;
  }
  uVar27 = CTable_MatchLength[lVar9 + uVar18 * 2 + 2] + 0x8000;
  uVar4 = (ushort)*CTable_OffsetBits;
  bVar2 = ofCodeTable[nbSeq - 1];
  uVar10 = (ulong)bVar2;
  lVar14 = (long)(1 << ((char)uVar4 - 1U & 0x1f));
  if (uVar4 == 0) {
    lVar14 = 1;
  }
  uVar20 = CTable_OffsetBits[lVar14 + uVar10 * 2 + 2] + 0x8000;
  local_b8 = (ulong)*(ushort *)
                     ((long)CTable_MatchLength +
                     (long)(int)CTable_MatchLength[lVar9 + uVar18 * 2 + 1] * 2 +
                     (ulong)((uVar27 & 0xffff0000) - CTable_MatchLength[lVar9 + uVar18 * 2 + 2] >>
                            ((byte)(uVar27 >> 0x10) & 0x3f)) * 2 + 4);
  local_b0 = (ulong)*(ushort *)
                     ((long)CTable_OffsetBits +
                     (long)(int)CTable_OffsetBits[lVar14 + uVar10 * 2 + 1] * 2 +
                     (ulong)((uVar20 & 0xffff0000) - CTable_OffsetBits[lVar14 + uVar10 * 2 + 2] >>
                            ((byte)(uVar20 >> 0x10) & 0x3f)) * 2 + 4);
  uVar5 = (ushort)*CTable_LitLength;
  lVar15 = (long)(1 << ((char)uVar5 - 1U & 0x1f));
  if (uVar5 == 0) {
    lVar15 = 1;
  }
  uVar16 = (ulong)llCodeTable[nbSeq - 1];
  uVar27 = CTable_LitLength[lVar15 + uVar16 * 2 + 2] + 0x8000;
  uVar6 = *(ushort *)
           ((long)CTable_LitLength +
           (long)(int)CTable_LitLength[lVar15 + uVar16 * 2 + 1] * 2 +
           (ulong)((uVar27 & 0xffff0000) - CTable_LitLength[lVar15 + uVar16 * 2 + 2] >>
                  ((byte)(uVar27 >> 0x10) & 0x3f)) * 2 + 4);
  uVar27 = LL_bits[uVar16];
  uVar16 = (ulong)((uint)sequences[nbSeq - 1].matchLength & BIT_mask[ML_bits[uVar18]]) <<
           ((byte)uVar27 & 0x3f) | (ulong)((uint)sequences[nbSeq - 1].litLength & BIT_mask[uVar27]);
  uVar27 = ML_bits[uVar18] + uVar27;
  puVar1 = (ulong *)((long)dst + (dstCapacity - 8));
  puVar12 = (ulong *)dst;
  if (longOffsets == 0) {
    uVar16 = (ulong)(BIT_mask[uVar10] & sequences[nbSeq - 1].offset) << ((byte)uVar27 & 0x3f) |
             uVar16;
    uVar27 = uVar27 + bVar2;
    goto LAB_00181b1e;
  }
  if (bVar2 < 0x38) {
    uVar20 = sequences[nbSeq - 1].offset;
LAB_00181aac:
    uVar18 = 0;
  }
  else {
    uVar20 = sequences[nbSeq - 1].offset;
    if (bVar2 == 0x38) {
      uVar10 = 0x38;
      goto LAB_00181aac;
    }
    uVar18 = (ulong)(bVar2 - 0x38);
    uVar16 = (ulong)(BIT_mask[uVar18] & uVar20) << ((byte)uVar27 & 0x3f) | uVar16;
    uVar27 = (uVar27 + bVar2) - 0x38;
    puVar12 = (ulong *)((ulong)(uVar27 >> 3) + (long)dst);
    if (puVar1 < puVar12) {
      puVar12 = puVar1;
    }
    *(ulong *)dst = uVar16;
    uVar16 = uVar16 >> ((byte)uVar27 & 0x38);
    uVar27 = uVar27 & 7;
    uVar10 = 0x38;
  }
  uVar16 = (ulong)(uVar20 >> ((byte)uVar18 & 0x1f) & BIT_mask[uVar10]) << ((byte)uVar27 & 0x3f) |
           uVar16;
  uVar27 = uVar27 + (int)uVar10;
LAB_00181b1e:
  puVar17 = (ulong *)((ulong)(uVar27 >> 3) + (long)puVar12);
  if (puVar1 < puVar17) {
    puVar17 = puVar1;
  }
  *puVar12 = uVar16;
  uVar16 = uVar16 >> ((byte)uVar27 & 0x38);
  uVar27 = uVar27 & 7;
  if (1 < nbSeq) {
    uVar18 = nbSeq - 2;
    do {
      uVar25 = (ulong)llCodeTable[uVar18];
      bVar2 = ofCodeTable[uVar18];
      uVar23 = (ulong)bVar2;
      uVar26 = (ulong)mlCodeTable[uVar18];
      uVar10 = CTable_OffsetBits[lVar14 + uVar23 * 2 + 2] + local_b0;
      uVar20 = (uint)local_b0;
      iVar7 = (int)(uVar10 >> 0x10) + uVar27;
      local_b0 = (ulong)*(ushort *)
                         ((long)CTable_OffsetBits +
                         (long)(int)CTable_OffsetBits[lVar14 + uVar23 * 2 + 1] * 2 +
                         (local_b0 >> ((byte)(uVar10 >> 0x10) & 0x3f)) * 2 + 4);
      uVar21 = CTable_MatchLength[lVar9 + uVar26 * 2 + 2] + local_b8;
      uVar19 = (uint)local_b8;
      iVar13 = (int)(uVar21 >> 0x10) + iVar7;
      uVar11 = (ulong)CTable_LitLength[lVar15 + uVar25 * 2 + 2] + (ulong)uVar6;
      local_b8 = (ulong)*(ushort *)
                         ((long)CTable_MatchLength +
                         (long)(int)CTable_MatchLength[lVar9 + uVar26 * 2 + 1] * 2 +
                         (local_b8 >> ((byte)(uVar21 >> 0x10) & 0x3f)) * 2 + 4);
      uVar16 = (ulong)(BIT_mask[uVar11 >> 0x10] & (uint)uVar6) << ((byte)iVar13 & 0x3f) |
               (ulong)(BIT_mask[uVar21 >> 0x10] & uVar19) << ((byte)iVar7 & 0x3f) |
               (ulong)(BIT_mask[uVar10 >> 0x10] & uVar20) << (sbyte)uVar27 | uVar16;
      uVar20 = LL_bits[uVar25];
      uVar27 = ML_bits[uVar26];
      uVar19 = (int)(uVar11 >> 0x10) + iVar13;
      uVar6 = *(ushort *)
               ((long)CTable_LitLength +
               (long)(int)CTable_LitLength[lVar15 + uVar25 * 2 + 1] * 2 +
               (ulong)(uVar6 >> ((byte)(uVar11 >> 0x10) & 0x3f)) * 2 + 4);
      uVar24 = uVar27 + uVar20 + bVar2;
      puVar12 = puVar17;
      if (0x1e < uVar24) {
        puVar12 = (ulong *)((ulong)(uVar19 >> 3) + (long)puVar17);
        if (puVar1 < puVar12) {
          puVar12 = puVar1;
        }
        *puVar17 = uVar16;
        uVar16 = uVar16 >> ((byte)uVar19 & 0x38);
        uVar19 = uVar19 & 7;
      }
      uVar16 = (ulong)((uint)sequences[uVar18].matchLength & BIT_mask[uVar27]) <<
               ((byte)(uVar20 + uVar19) & 0x3f) |
               (ulong)((uint)sequences[uVar18].litLength & BIT_mask[uVar20]) <<
               ((byte)uVar19 & 0x3f) | uVar16;
      uVar27 = uVar27 + uVar20 + uVar19;
      puVar22 = puVar12;
      if (0x38 < uVar24) {
        puVar22 = (ulong *)((ulong)(uVar27 >> 3) + (long)puVar12);
        if (puVar1 < puVar22) {
          puVar22 = puVar1;
        }
        *puVar12 = uVar16;
        uVar16 = uVar16 >> ((byte)uVar27 & 0x38);
        uVar27 = uVar27 & 7;
      }
      if (longOffsets == 0) {
        uVar16 = (ulong)(BIT_mask[uVar23] & sequences[uVar18].offset) << ((byte)uVar27 & 0x3f) |
                 uVar16;
        uVar27 = uVar27 + bVar2;
      }
      else {
        puVar12 = puVar22;
        if (bVar2 < 0x38) {
          uVar20 = sequences[uVar18].offset;
          uVar10 = 0;
        }
        else {
          uVar10 = 0;
          uVar20 = sequences[uVar18].offset;
          if (bVar2 == 0x38) {
            uVar23 = 0x38;
          }
          else {
            uVar10 = (ulong)(bVar2 - 0x38);
            uVar16 = (ulong)(BIT_mask[uVar10] & uVar20) << ((byte)uVar27 & 0x3f) | uVar16;
            uVar27 = (uVar27 + bVar2) - 0x38;
            puVar12 = (ulong *)((ulong)(uVar27 >> 3) + (long)puVar22);
            if (puVar1 < puVar12) {
              puVar12 = puVar1;
            }
            *puVar22 = uVar16;
            uVar16 = uVar16 >> ((byte)uVar27 & 0x38);
            uVar27 = uVar27 & 7;
            uVar23 = 0x38;
          }
        }
        uVar16 = (ulong)(uVar20 >> ((byte)uVar10 & 0x1f) & BIT_mask[uVar23]) <<
                 ((byte)uVar27 & 0x3f) | uVar16;
        uVar27 = uVar27 + (int)uVar23;
        puVar22 = puVar12;
      }
      puVar17 = (ulong *)((ulong)(uVar27 >> 3) + (long)puVar22);
      if (puVar1 < puVar17) {
        puVar17 = puVar1;
      }
      *puVar22 = uVar16;
      uVar16 = uVar16 >> ((byte)uVar27 & 0x38);
      uVar18 = uVar18 - 1;
      uVar27 = uVar27 & 7;
    } while (uVar18 < nbSeq);
  }
  uVar16 = (ulong)((uint)local_b8 & BIT_mask[uVar3]) << (sbyte)uVar27 | uVar16;
  uVar27 = uVar27 + uVar3;
  puVar12 = (ulong *)((ulong)(uVar27 >> 3) + (long)puVar17);
  if (puVar1 < puVar12) {
    puVar12 = puVar1;
  }
  *puVar17 = uVar16;
  uVar18 = (ulong)((uint)local_b0 & BIT_mask[uVar4]) << (sbyte)(uVar27 & 7) |
           uVar16 >> ((byte)uVar27 & 0x38);
  uVar27 = (uVar27 & 7) + (uint)uVar4;
  puVar17 = (ulong *)((ulong)(uVar27 >> 3) + (long)puVar12);
  if (puVar1 < puVar17) {
    puVar17 = puVar1;
  }
  *puVar12 = uVar18;
  uVar18 = (ulong)((uint)uVar6 & BIT_mask[uVar5]) << (sbyte)(uVar27 & 7) |
           uVar18 >> ((byte)uVar27 & 0x38);
  uVar27 = (uVar27 & 7) + (uint)uVar5;
  puVar12 = (ulong *)((ulong)(uVar27 >> 3) + (long)puVar17);
  if (puVar1 < puVar12) {
    puVar12 = puVar1;
  }
  *puVar17 = uVar18;
  uVar20 = (uVar27 & 7) + 1;
  *puVar12 = uVar18 >> ((byte)uVar27 & 0x38) | 1L << (uVar27 & 7);
  puVar12 = (ulong *)((ulong)(uVar20 >> 3) + (long)puVar12);
  if (puVar1 < puVar12) {
    puVar12 = puVar1;
  }
  if ((puVar1 <= puVar12) ||
     (sVar8 = (long)puVar12 + ((ulong)((uVar20 & 7) != 0) - (long)dst), sVar8 == 0)) {
    sVar8 = 0xffffffffffffffba;
  }
  return sVar8;
}

Assistant:

size_t ZSTD_encodeSequences(
            void* dst, size_t dstCapacity,
            FSE_CTable const* CTable_MatchLength, BYTE const* mlCodeTable,
            FSE_CTable const* CTable_OffsetBits, BYTE const* ofCodeTable,
            FSE_CTable const* CTable_LitLength, BYTE const* llCodeTable,
            seqDef const* sequences, size_t nbSeq, int longOffsets, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        return ZSTD_encodeSequences_bmi2(dst, dstCapacity,
                                         CTable_MatchLength, mlCodeTable,
                                         CTable_OffsetBits, ofCodeTable,
                                         CTable_LitLength, llCodeTable,
                                         sequences, nbSeq, longOffsets);
    }
#endif
    (void)bmi2;
    return ZSTD_encodeSequences_default(dst, dstCapacity,
                                        CTable_MatchLength, mlCodeTable,
                                        CTable_OffsetBits, ofCodeTable,
                                        CTable_LitLength, llCodeTable,
                                        sequences, nbSeq, longOffsets);
}